

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cab_filename.c
# Opt level: O3

void test_read_format_cab_filename(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive *paVar4;
  int64_t iVar5;
  archive_entry *ae;
  archive_entry *local_38;
  
  extract_reference_file("test_read_format_cab_filename_cp932.cab");
  pcVar3 = setlocale(6,"ja_JP.eucJP");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                   ,L'(');
    test_skipping("ja_JP.eucJP locale not available on this system.");
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                     ,L',',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4
                       );
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4
                       );
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=CP932");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_cab_filename_cp932.cab",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'5',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                 ,L';',anon_var_dwarf_560be,
                 "\"\\xc9\\xbd\\xa4\\xc0\\xa4\\xe8\\x2f\\xb4\\xc1\\xbb\\xfa\\x2e\\x74\\x78\\x74\"",
                 pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'<',5,"5",iVar5,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'=',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'>',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                 ,L'D',anon_var_dwarf_56178,
                 "\"\\xc9\\xbd\\xa4\\xc0\\xa4\\xe8\\x2f\\xb0\\xec\\xcd\\xf7\\xc9\\xbd\\x2e\\x74\\x78\\x74\""
                 ,pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'E',5,"5",iVar5,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'F',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'G',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'K',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'N',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'O',0xc0000,"ARCHIVE_FORMAT_CAB",(long)iVar1,"archive_format(a)",paVar4)
      ;
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                     ,L'0');
      test_skipping("This system cannot convert character-set from CP932 to eucJP.");
    }
    iVar1 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'S',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'T',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                   ,L'a');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                     ,L'e',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4
                       );
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'g',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4
                       );
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=CP932");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_cab_filename_cp932.cab",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'n',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                 ,L'~',anon_var_dwarf_56244,
                 "\"\\xe8\\xa1\\xa8\\xe3\\x81\\xa0\\xe3\\x82\\x88\\x2f\" \"\\xe6\\xbc\\xa2\\xe5\\xad\\x97\\x2e\\x74\\x78\\x74\""
                 ,pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\x01');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x7f',5,"5",iVar5,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x81',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x82',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                 ,L'\x91',anon_var_dwarf_56264,
                 "\"\\xe8\\xa1\\xa8\\xe3\\x81\\xa0\\xe3\\x82\\x88\\x2f\" \"\\xe4\\xb8\\x80\\xe8\\xa6\\xa7\\xe8\\xa1\\xa8\\x2e\\x74\\x78\\x74\""
                 ,pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\x01');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x93',5,"5",iVar5,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x94',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x95',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x99',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x9c',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x9d',0xc0000,"ARCHIVE_FORMAT_CAB",(long)iVar1,"archive_format(a)",
                          paVar4);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                     ,L'i');
      test_skipping("This system cannot convert character-set from CP932 to UTF-8.");
    }
    iVar1 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'¡',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'¢',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cab_filename)
{
	const char *refname = "test_read_format_cab_filename_cp932.cab";

	extract_reference_file(refname);
	test_read_format_cab_filename_CP932_eucJP(refname);
	test_read_format_cab_filename_CP932_UTF8(refname);
}